

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cc
# Opt level: O0

void __thiscall flow::Value::removeUse(Value *this,Instr *user)

{
  bool bVar1;
  const_iterator local_48;
  __normal_iterator<flow::Instr_**,_std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>_>
  local_40;
  __normal_iterator<flow::Instr_**,_std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>_>
  local_38;
  Instr **local_30;
  __normal_iterator<flow::Instr_**,_std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>_>
  local_28;
  __normal_iterator<flow::Instr_**,_std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>_>
  local_20;
  __normal_iterator<flow::Instr_**,_std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>_> i;
  Instr *user_local;
  Value *this_local;
  
  i._M_current = (Instr **)user;
  local_28._M_current =
       (Instr **)std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>::begin(&this->uses_);
  local_30 = (Instr **)std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>::end(&this->uses_)
  ;
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<flow::Instr**,std::vector<flow::Instr*,std::allocator<flow::Instr*>>>,flow::Instr*>
                       (local_28,(__normal_iterator<flow::Instr_**,_std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>_>
                                  )local_30,(Instr **)&i);
  local_38._M_current =
       (Instr **)std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>::end(&this->uses_);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_38);
  if (bVar1) {
    local_40._M_current =
         (Instr **)std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>::end(&this->uses_);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_40);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<flow::Instr*const*,std::vector<flow::Instr*,std::allocator<flow::Instr*>>>::
      __normal_iterator<flow::Instr**>
                ((__normal_iterator<flow::Instr*const*,std::vector<flow::Instr*,std::allocator<flow::Instr*>>>
                  *)&local_48,&local_20);
      std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>::erase(&this->uses_,local_48);
    }
    return;
  }
  __assert_fail("i != uses_.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/Value.cc"
                ,0x34,"void flow::Value::removeUse(Instr *)");
}

Assistant:

void Value::removeUse(Instr* user) {
  auto i = std::find(uses_.begin(), uses_.end(), user);

  assert(i != uses_.end());

  if (i != uses_.end()) {
    uses_.erase(i);
  }
}